

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_time.c
# Opt level: O0

void * metro_new(t_symbol *unitname,t_floatarg f,t_floatarg tempo)

{
  t_metro *x_00;
  _clock *p_Var1;
  t_symbol *ptVar2;
  t_symbol *s2;
  t_metro *x;
  t_floatarg tempo_local;
  t_floatarg f_local;
  t_symbol *unitname_local;
  
  x_00 = (t_metro *)pd_new(metro_class);
  metro_ft1(x_00,f);
  x_00->x_hit = 0;
  p_Var1 = clock_new(x_00,metro_tick);
  x_00->x_clock = p_Var1;
  ptVar2 = gensym("bang");
  outlet_new((t_object *)x_00,ptVar2);
  ptVar2 = gensym("float");
  s2 = gensym("ft1");
  inlet_new((t_object *)x_00,(t_pd *)x_00,ptVar2,s2);
  if ((tempo != 0.0) || (NAN(tempo))) {
    metro_tempo(x_00,unitname,tempo);
  }
  return x_00;
}

Assistant:

static void *metro_new(t_symbol *unitname, t_floatarg f, t_floatarg tempo)
{
    t_metro *x = (t_metro *)pd_new(metro_class);
    metro_ft1(x, f);
    x->x_hit = 0;
    x->x_clock = clock_new(x, (t_method)metro_tick);
    outlet_new(&x->x_obj, gensym("bang"));
    inlet_new(&x->x_obj, &x->x_obj.ob_pd, gensym("float"), gensym("ft1"));
    if (tempo != 0)
        metro_tempo(x, unitname, tempo);
    return (x);
}